

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClockingDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingDeclarationSyntax,slang::syntax::ClockingDeclarationSyntax_const&>
          (BumpAllocator *this,ClockingDeclarationSyntax *args)

{
  ClockingDeclarationSyntax *this_00;
  
  this_00 = (ClockingDeclarationSyntax *)allocate(this,0xf8,8);
  slang::syntax::ClockingDeclarationSyntax::ClockingDeclarationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }